

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O0

void __thiscall PSBTInput::Merge(PSBTInput *this,PSBTInput *input)

{
  long lVar1;
  bool bVar2;
  map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  *this_00;
  base_blob<256U> *this_01;
  _Rb_tree_const_iterator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>
  __last;
  _Rb_tree_const_iterator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>
  __first;
  const_iterator this_02;
  const_iterator __x;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  CTxOut *in_stack_fffffffffffffee8;
  CTxOut *in_stack_fffffffffffffef0;
  CTxOut *in_stack_fffffffffffffef8;
  _Rb_tree_const_iterator<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  in_stack_ffffffffffffff00;
  _Rb_tree_const_iterator<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  in_stack_ffffffffffffff08;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::__shared_ptr::operator_cast_to_bool
                    ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                     in_stack_fffffffffffffee8);
  if ((!bVar2) &&
     (bVar2 = std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                         in_stack_fffffffffffffee8), bVar2)) {
    std::shared_ptr<const_CTransaction>::operator=
              ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffef8,
               (shared_ptr<const_CTransaction> *)in_stack_fffffffffffffef0);
  }
  bVar2 = CTxOut::IsNull(in_stack_fffffffffffffee8);
  if ((bVar2) && (bVar2 = CTxOut::IsNull(in_stack_fffffffffffffee8), !bVar2)) {
    CTxOut::operator=(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  }
  this_00 = (map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
             *)(in_RDI + 0xe0);
  std::
  map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  ::begin(this_00);
  std::
  map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  ::end(this_00);
  std::
  map<CKeyID,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
  ::
  insert<std::_Rb_tree_const_iterator<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
            ((map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
              *)in_stack_fffffffffffffee8,
             (_Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              )in_stack_ffffffffffffff08._M_node,
             (_Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              )in_stack_ffffffffffffff00._M_node);
  this_01 = (base_blob<256U> *)(in_RDI + 0x110);
  std::
  map<uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::begin((map<uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           *)this_00);
  std::
  map<uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::end((map<uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         *)this_00);
  std::
  map<uint160,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::less<uint160>,std::allocator<std::pair<uint160_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
  ::
  insert<std::_Rb_tree_const_iterator<std::pair<uint160_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ((map<uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *)in_stack_fffffffffffffee8,
             (_Rb_tree_const_iterator<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              )in_stack_ffffffffffffff08._M_node,in_stack_ffffffffffffff00);
  __last._M_node = (_Base_ptr)(in_RDI + 0x140);
  std::
  map<uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::begin((map<uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           *)this_00);
  std::
  map<uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::end((map<uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         *)this_00);
  std::
  map<uint256,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
  ::
  insert<std::_Rb_tree_const_iterator<std::pair<uint256_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ((map<uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *)in_stack_fffffffffffffee8,in_stack_ffffffffffffff08,
             (_Rb_tree_const_iterator<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              )__last._M_node);
  __first._M_node = (_Base_ptr)(in_RDI + 0x170);
  std::
  map<uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::begin((map<uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           *)this_00);
  std::
  map<uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::end((map<uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         *)this_00);
  std::
  map<uint160,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::less<uint160>,std::allocator<std::pair<uint160_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
  ::
  insert<std::_Rb_tree_const_iterator<std::pair<uint160_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ((map<uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *)in_stack_fffffffffffffee8,
             (_Rb_tree_const_iterator<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              )__first._M_node,
             (_Rb_tree_const_iterator<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              )__last._M_node);
  std::
  map<uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::begin((map<uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           *)this_00);
  std::
  map<uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::end((map<uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         *)this_00);
  std::
  map<uint256,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
  ::
  insert<std::_Rb_tree_const_iterator<std::pair<uint256_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ((map<uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *)in_stack_fffffffffffffee8,
             (_Rb_tree_const_iterator<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              )__first._M_node,
             (_Rb_tree_const_iterator<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              )__last._M_node);
  std::
  map<CPubKey,_KeyOriginInfo,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_KeyOriginInfo>_>_>
  ::begin((map<CPubKey,_KeyOriginInfo,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_KeyOriginInfo>_>_>
           *)this_00);
  this_02 = std::
            map<CPubKey,_KeyOriginInfo,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_KeyOriginInfo>_>_>
            ::end((map<CPubKey,_KeyOriginInfo,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_KeyOriginInfo>_>_>
                   *)this_00);
  std::
  map<CPubKey,KeyOriginInfo,std::less<CPubKey>,std::allocator<std::pair<CPubKey_const,KeyOriginInfo>>>
  ::insert<std::_Rb_tree_const_iterator<std::pair<CPubKey_const,KeyOriginInfo>>>
            ((map<CPubKey,_KeyOriginInfo,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_KeyOriginInfo>_>_>
              *)in_stack_fffffffffffffee8,
             (_Rb_tree_const_iterator<std::pair<const_CPubKey,_KeyOriginInfo>_>)__first._M_node,
             (_Rb_tree_const_iterator<std::pair<const_CPubKey,_KeyOriginInfo>_>)__last._M_node);
  __x = std::
        map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::begin((map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 *)this_00);
  std::
  map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::end((map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         *)this_00);
  std::
  map<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
  ::
  insert<std::_Rb_tree_const_iterator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ((map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *)in_stack_fffffffffffffee8,
             (_Rb_tree_const_iterator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              )__first._M_node,
             (_Rb_tree_const_iterator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              )__last._M_node);
  std::
  map<std::pair<XOnlyPubKey,_uint256>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::pair<XOnlyPubKey,_uint256>_>,_std::allocator<std::pair<const_std::pair<XOnlyPubKey,_uint256>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::begin((map<std::pair<XOnlyPubKey,_uint256>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::pair<XOnlyPubKey,_uint256>_>,_std::allocator<std::pair<const_std::pair<XOnlyPubKey,_uint256>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           *)this_00);
  std::
  map<std::pair<XOnlyPubKey,_uint256>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::pair<XOnlyPubKey,_uint256>_>,_std::allocator<std::pair<const_std::pair<XOnlyPubKey,_uint256>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::end((map<std::pair<XOnlyPubKey,_uint256>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::pair<XOnlyPubKey,_uint256>_>,_std::allocator<std::pair<const_std::pair<XOnlyPubKey,_uint256>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         *)this_00);
  std::
  map<std::pair<XOnlyPubKey,uint256>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::less<std::pair<XOnlyPubKey,uint256>>,std::allocator<std::pair<std::pair<XOnlyPubKey,uint256>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
  ::
  insert<std::_Rb_tree_const_iterator<std::pair<std::pair<XOnlyPubKey,uint256>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ((map<std::pair<XOnlyPubKey,_uint256>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::pair<XOnlyPubKey,_uint256>_>,_std::allocator<std::pair<const_std::pair<XOnlyPubKey,_uint256>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *)in_stack_fffffffffffffee8,
             (_Rb_tree_const_iterator<std::pair<const_std::pair<XOnlyPubKey,_uint256>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              )__first._M_node,
             (_Rb_tree_const_iterator<std::pair<const_std::pair<XOnlyPubKey,_uint256>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              )__last._M_node);
  std::
  map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
  ::begin((map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
           *)this_00);
  std::
  map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
  ::end((map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
         *)this_00);
  std::
  map<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>,std::set<std::vector<unsigned_char,std::allocator<unsigned_char>>,ShortestVectorFirstComparator,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>>,std::allocator<std::pair<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>const,std::set<std::vector<unsigned_char,std::allocator<unsigned_char>>,ShortestVectorFirstComparator,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>>
  ::
  insert<std::_Rb_tree_const_iterator<std::pair<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>const,std::set<std::vector<unsigned_char,std::allocator<unsigned_char>>,ShortestVectorFirstComparator,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>>
            ((map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
              *)in_stack_fffffffffffffee8,
             (_Rb_tree_const_iterator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
              )__first._M_node,
             (_Rb_tree_const_iterator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
              )__last._M_node);
  std::
  map<XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>_>
  ::begin((map<XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>_>
           *)this_00);
  std::
  map<XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>_>
  ::end((map<XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>_>
         *)this_00);
  std::
  map<XOnlyPubKey,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>>
  ::
  insert<std::_Rb_tree_const_iterator<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>>
            ((map<XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>_>
              *)in_stack_fffffffffffffee8,__first,__last);
  bVar2 = prevector<28U,_unsigned_char,_unsigned_int,_int>::empty
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_fffffffffffffee8);
  if ((bVar2) &&
     (bVar2 = prevector<28U,_unsigned_char,_unsigned_int,_int>::empty
                        ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                         in_stack_fffffffffffffee8), !bVar2)) {
    CScript::operator=((CScript *)this_01,(CScript *)this_00);
  }
  bVar2 = prevector<28U,_unsigned_char,_unsigned_int,_int>::empty
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_fffffffffffffee8);
  if ((bVar2) &&
     (bVar2 = prevector<28U,_unsigned_char,_unsigned_int,_int>::empty
                        ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                         in_stack_fffffffffffffee8), !bVar2)) {
    CScript::operator=((CScript *)this_01,(CScript *)this_00);
  }
  bVar2 = prevector<28U,_unsigned_char,_unsigned_int,_int>::empty
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_fffffffffffffee8);
  if ((bVar2) &&
     (bVar2 = prevector<28U,_unsigned_char,_unsigned_int,_int>::empty
                        ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                         in_stack_fffffffffffffee8), !bVar2)) {
    CScript::operator=((CScript *)this_01,(CScript *)this_00);
  }
  bVar2 = CScriptWitness::IsNull((CScriptWitness *)in_stack_fffffffffffffee8);
  if ((bVar2) &&
     (bVar2 = CScriptWitness::IsNull((CScriptWitness *)in_stack_fffffffffffffee8), !bVar2)) {
    CScriptWitness::operator=((CScriptWitness *)this_01,(CScriptWitness *)this_00);
  }
  bVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_01);
  if ((bVar2) &&
     (bVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_01), !bVar2))
  {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_02._M_node,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__x._M_node);
  }
  bVar2 = XOnlyPubKey::IsNull((XOnlyPubKey *)in_stack_fffffffffffffee8);
  if ((bVar2) && (bVar2 = XOnlyPubKey::IsNull((XOnlyPubKey *)in_stack_fffffffffffffee8), !bVar2)) {
    *(undefined8 *)(in_RDI + 0x278) = *(undefined8 *)(in_RSI + 0x278);
    *(undefined8 *)(in_RDI + 0x280) = *(undefined8 *)(in_RSI + 0x280);
    *(undefined8 *)(in_RDI + 0x288) = *(undefined8 *)(in_RSI + 0x288);
    *(undefined8 *)(in_RDI + 0x290) = *(undefined8 *)(in_RSI + 0x290);
  }
  bVar2 = base_blob<256U>::IsNull(this_01);
  if ((bVar2) && (bVar2 = base_blob<256U>::IsNull(this_01), !bVar2)) {
    *(undefined8 *)(in_RDI + 0x298) = *(undefined8 *)(in_RSI + 0x298);
    *(undefined8 *)(in_RDI + 0x2a0) = *(undefined8 *)(in_RSI + 0x2a0);
    *(undefined8 *)(in_RDI + 0x2a8) = *(undefined8 *)(in_RSI + 0x2a8);
    *(undefined8 *)(in_RDI + 0x2b0) = *(undefined8 *)(in_RSI + 0x2b0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PSBTInput::Merge(const PSBTInput& input)
{
    if (!non_witness_utxo && input.non_witness_utxo) non_witness_utxo = input.non_witness_utxo;
    if (witness_utxo.IsNull() && !input.witness_utxo.IsNull()) {
        witness_utxo = input.witness_utxo;
    }

    partial_sigs.insert(input.partial_sigs.begin(), input.partial_sigs.end());
    ripemd160_preimages.insert(input.ripemd160_preimages.begin(), input.ripemd160_preimages.end());
    sha256_preimages.insert(input.sha256_preimages.begin(), input.sha256_preimages.end());
    hash160_preimages.insert(input.hash160_preimages.begin(), input.hash160_preimages.end());
    hash256_preimages.insert(input.hash256_preimages.begin(), input.hash256_preimages.end());
    hd_keypaths.insert(input.hd_keypaths.begin(), input.hd_keypaths.end());
    unknown.insert(input.unknown.begin(), input.unknown.end());
    m_tap_script_sigs.insert(input.m_tap_script_sigs.begin(), input.m_tap_script_sigs.end());
    m_tap_scripts.insert(input.m_tap_scripts.begin(), input.m_tap_scripts.end());
    m_tap_bip32_paths.insert(input.m_tap_bip32_paths.begin(), input.m_tap_bip32_paths.end());

    if (redeem_script.empty() && !input.redeem_script.empty()) redeem_script = input.redeem_script;
    if (witness_script.empty() && !input.witness_script.empty()) witness_script = input.witness_script;
    if (final_script_sig.empty() && !input.final_script_sig.empty()) final_script_sig = input.final_script_sig;
    if (final_script_witness.IsNull() && !input.final_script_witness.IsNull()) final_script_witness = input.final_script_witness;
    if (m_tap_key_sig.empty() && !input.m_tap_key_sig.empty()) m_tap_key_sig = input.m_tap_key_sig;
    if (m_tap_internal_key.IsNull() && !input.m_tap_internal_key.IsNull()) m_tap_internal_key = input.m_tap_internal_key;
    if (m_tap_merkle_root.IsNull() && !input.m_tap_merkle_root.IsNull()) m_tap_merkle_root = input.m_tap_merkle_root;
}